

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O0

void __thiscall Node::ScanOneMap(Node *this,VariableStruct *MapVar,int skipprefix)

{
  pointer *this_00;
  int iVar1;
  ostream *poVar2;
  void *this_01;
  string local_258 [32];
  undefined1 local_238 [8];
  VariableStruct NewVar_2;
  undefined1 local_180 [8];
  VariableStruct NewVar_1;
  string local_d8 [32];
  undefined1 local_b8 [8];
  VariableStruct NewVar;
  int skipprefix_local;
  VariableStruct *MapVar_local;
  Node *this_local;
  
  iVar1 = this->Type;
  NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = skipprefix;
  if ((((((iVar1 != 0x110) && (iVar1 != 0x123)) && (iVar1 != 300)) &&
       ((iVar1 != 0x149 && (iVar1 != 0x14f)))) &&
      ((iVar1 != 0x157 && ((iVar1 != 0x15f && (iVar1 != 0x182)))))) &&
     ((iVar1 != 0x191 && ((iVar1 != 0x1a0 && (iVar1 != 0x1ba)))))) {
    if (iVar1 == 0x1d3) {
      std::__cxx11::string::string(local_d8,(string *)&this->TextValue);
      VariableStruct::VariableStruct
                ((VariableStruct *)local_b8,(string *)local_d8,VARTYPE_NONE,VARCLASS_MAP,1,0);
      std::__cxx11::string::~string(local_d8);
      if (NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        std::__cxx11::string::operator=((string *)&NewVar.field_0x40,(string *)&MapVar->CName);
      }
      VariableList::Append(Variables,(VariableStruct *)local_b8,0);
      VariableStruct::~VariableStruct((VariableStruct *)local_b8);
      goto LAB_001125d1;
    }
    if (iVar1 == 0x1d8) {
      std::__cxx11::string::string(local_258,(string *)&this->Tree[0]->TextValue);
      VariableStruct::VariableStruct
                ((VariableStruct *)local_238,(string *)local_258,VARTYPE_NONE,VARCLASS_MAP,1,0);
      std::__cxx11::string::~string(local_258);
      if (NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        std::__cxx11::string::operator=((string *)&NewVar_2.field_0x40,(string *)&MapVar->CName);
      }
      VariableList::Append(Variables,(VariableStruct *)local_238,0);
      VariableStruct::~VariableStruct((VariableStruct *)local_238);
      goto LAB_001125d1;
    }
    if (iVar1 == 0x1f5) {
      if (this->Tree[0] != (Node *)0x0) {
        ScanOneMap(this->Tree[0],MapVar,skipprefix);
      }
      if (this->Tree[1] != (Node *)0x0) {
        ScanOneMap(this->Tree[1],MapVar,
                   NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
      }
      goto LAB_001125d1;
    }
    if (iVar1 != 0x204) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Undefined type ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Type);
      poVar2 = std::operator<<(poVar2,"@");
      this_01 = (void *)std::ostream::operator<<(poVar2,this->lineno);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      goto LAB_001125d1;
    }
  }
  this_00 = &NewVar_2.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)this_00,(string *)&this->Tree[1]->TextValue);
  VariableStruct::VariableStruct
            ((VariableStruct *)local_180,(string *)this_00,VARTYPE_NONE,VARCLASS_MAP,1,0);
  std::__cxx11::string::~string
            ((string *)
             &NewVar_2.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    std::__cxx11::string::operator=((string *)&NewVar_1.field_0x40,(string *)&MapVar->CName);
  }
  VariableList::Append(Variables,(VariableStruct *)local_180,0);
  VariableStruct::~VariableStruct((VariableStruct *)local_180);
LAB_001125d1:
  if (this->Block[0] != (Node *)0x0) {
    ScanOneMap(this->Block[0],MapVar,
               NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
  }
  return;
}

Assistant:

void Node::ScanOneMap(
	VariableStruct* MapVar,	/**< Main map variable */
	int skipprefix
)
{
	switch (Type)
	{
	case BAS_N_LIST:
 
		if (Tree[0] != 0)
		{
			Tree[0]->ScanOneMap(MapVar, skipprefix);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->ScanOneMap(MapVar, skipprefix);
		}
		break;                                                                   
	case BAS_V_NAME:
 
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
	case BAS_N_VARTYPE:
	case BAS_S_BYTE:
	case BAS_S_DOUBLE:
	case BAS_S_GFLOAT:
	case BAS_S_HFLOAT:
	case BAS_S_LONG:
	case BAS_S_WORD:
	case BAS_S_INTEGER:
	case BAS_S_REAL:
	case BAS_S_RFA:
	case BAS_S_STRING:
	case BAS_S_DECIMAL:
 
		{
			VariableStruct NewVar(Tree[1]->TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
// FIXME: This is just to have something here, but it doesn't do
// the right thing yet
	case BAS_V_DEFINEVAR:
 
		{
			VariableStruct NewVar(Tree[0]->TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
	default:
		std::cerr << "Undefined type " << Type << "@" << lineno << std::endl;
		break;
	}
 
	if (Block[0] != 0)
	{
		Block[0]->ScanOneMap(MapVar, skipprefix);
	}
}